

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O0

void __thiscall
asio::detail::
recycling_allocator<asio::detail::wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
::deallocate(recycling_allocator<asio::detail::wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
             *this,wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                   *p,size_t n)

{
  thread_info_base *ptVar1;
  long in_RDX;
  undefined8 in_RSI;
  
  ptVar1 = thread_context::top_of_thread_call_stack();
  thread_info_base::deallocate<asio::detail::thread_info_base::default_tag>
            (ptVar1,in_RSI,in_RDX << 7);
  return;
}

Assistant:

void deallocate(T* p, std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    thread_info_base::deallocate(Purpose(),
        thread_context::top_of_thread_call_stack(), p, sizeof(T) * n);
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    (void)n;
    asio::aligned_delete(p);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
  }